

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectangularVolumeRecord2.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::RectangularVolumeRecord2::Encode
          (RectangularVolumeRecord2 *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  RectangularVolumeRecord2 *this_local;
  
  pKVar1 = KDataStream::operator<<
                     (stream,(this->super_RectangularVolumeRecord1).super_EnvironmentRecord.
                             m_ui32EnvRecTyp);
  pKVar1 = KDataStream::operator<<
                     (pKVar1,(this->super_RectangularVolumeRecord1).super_EnvironmentRecord.
                             m_ui16Length);
  pKVar1 = KDataStream::operator<<
                     (pKVar1,(this->super_RectangularVolumeRecord1).super_EnvironmentRecord.
                             m_ui8Index);
  pKVar1 = KDataStream::operator<<
                     (pKVar1,(this->super_RectangularVolumeRecord1).super_EnvironmentRecord.
                             m_ui8Padding);
  pKVar1 = DATA_TYPE::operator<<
                     (pKVar1,&(this->super_RectangularVolumeRecord1).m_CornerLocation.
                              super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<
                     (pKVar1,&(this->super_RectangularVolumeRecord1).m_RecLength.super_DataTypeBase)
  ;
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_DDT).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<
                     (pKVar1,&(this->super_RectangularVolumeRecord1).m_Ori.super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_Velocity).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_AngularVelocity).super_DataTypeBase);
  KDataStream::operator<<(pKVar1,(float)this->m_f32Padding);
  return;
}

Assistant:

void RectangularVolumeRecord2::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << KDIS_STREAM m_CornerLocation
           << KDIS_STREAM m_RecLength
           << KDIS_STREAM m_DDT
           << KDIS_STREAM m_Ori
           << KDIS_STREAM m_Velocity
           << KDIS_STREAM m_AngularVelocity
           << m_f32Padding;
}